

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O1

bool DiffTemplates(char *filename_a,char *filename_b,Strip strip)

{
  pointer pVVar1;
  size_t sVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  string *psVar8;
  string *psVar9;
  vector<VariableAndMod,_std::allocator<VariableAndMod>_> vars_and_mods_b;
  vector<VariableAndMod,_std::allocator<VariableAndMod>_> vars_and_mods_a;
  uint local_ac;
  VariableAndMods local_a8;
  VariableAndMods local_88;
  string local_70;
  string local_50;
  
  local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar4 = LoadVariables(filename_a,strip,&local_88);
  if ((bVar4) && (bVar4 = LoadVariables(filename_b,strip,&local_a8), bVar4)) {
    lVar6 = (long)local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 6;
    if (lVar6 != (long)local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6) {
      LogPrintf(4,"Templates differ: %s [%d vars] vs. %s [%d vars].\n",filename_a,lVar6,filename_b);
    }
    local_ac = 0;
    if (local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      if (local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        psVar8 = &(local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                   _M_impl.super__Vector_impl_data._M_start)->modifiers;
        psVar9 = &(local_a8.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                   _M_impl.super__Vector_impl_data._M_start)->modifiers;
        uVar7 = 0;
        local_ac = 0;
        do {
          sVar2 = (((VariableAndMod *)(psVar8 + -1))->variable_name)._M_string_length;
          if ((sVar2 != (((VariableAndMod *)(psVar9 + -1))->variable_name)._M_string_length) ||
             ((sVar2 != 0 &&
              (iVar5 = bcmp((((VariableAndMod *)(psVar8 + -1))->variable_name)._M_dataplus._M_p,
                            (((VariableAndMod *)(psVar9 + -1))->variable_name)._M_dataplus._M_p,
                            sVar2), iVar5 != 0)))) {
            LogPrintf(4,"Variable name mismatch: %s vs. %s\n",
                      (((VariableAndMod *)(psVar8 + -1))->variable_name)._M_dataplus._M_p,
                      (((VariableAndMod *)(psVar9 + -1))->variable_name)._M_dataplus._M_p);
          }
          iVar5 = std::__cxx11::string::compare((char *)psVar8);
          if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)psVar9), iVar5 == 0)) {
            uVar7 = uVar7 + 1;
          }
          else {
            sVar2 = psVar8->_M_string_length;
            bVar4 = true;
            if (sVar2 == psVar9->_M_string_length) {
              if (sVar2 == 0) {
                bVar4 = false;
              }
              else {
                iVar5 = bcmp((psVar8->_M_dataplus)._M_p,(psVar9->_M_dataplus)._M_p,sVar2);
                bVar4 = iVar5 != 0;
              }
            }
            if (bVar4) {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              pcVar3 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              pcVar3 = (psVar9->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar3,pcVar3 + psVar9->_M_string_length);
              bVar4 = SuppressLameDiff(&local_70,&local_50);
              bVar4 = !bVar4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
            }
            else {
              bVar4 = false;
            }
            if (bVar4) {
              local_ac = local_ac + 1;
              LogPrintf(1,"Difference for variable %s -- %s vs. %s\n",
                        (((VariableAndMod *)(psVar8 + -1))->variable_name)._M_dataplus._M_p,
                        (psVar8->_M_dataplus)._M_p,(psVar9->_M_dataplus)._M_p);
            }
          }
          if ((pointer)(psVar8 + 1) ==
              local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          pVVar1 = (pointer)(psVar9 + 1);
          psVar8 = psVar8 + 2;
          psVar9 = psVar9 + 2;
        } while (pVVar1 != local_a8.
                           super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    LogPrintf(0,"Variables Found: Total=%d; Diffs=%d; NoMods=%d\n",
              (long)local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 6,(ulong)local_ac,(ulong)uVar7);
    bVar4 = local_ac == 0;
  }
  else {
    bVar4 = false;
  }
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::~vector(&local_a8);
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::~vector(&local_88);
  return bVar4;
}

Assistant:

bool DiffTemplates(const char* filename_a, const char* filename_b,
                   Strip strip) {
  vector<VariableAndMod> vars_and_mods_a, vars_and_mods_b;

  if (!LoadVariables(filename_a, strip, vars_and_mods_a) ||
      !LoadVariables(filename_b, strip, vars_and_mods_b))
    return false;

  if (vars_and_mods_a.size() != vars_and_mods_b.size())
    LogPrintf(LOG_FATAL, "Templates differ: %s [%d vars] vs. %s [%d vars].\n",
              filename_a, vars_and_mods_a.size(),
              filename_b, vars_and_mods_b.size());

  int mismatch_count = 0;      // How many differences there were.
  int no_modifiers_count = 0;  // How many variables without modifiers.
  VariableAndMods::const_iterator iter_a, iter_b;
  for (iter_a = vars_and_mods_a.begin(), iter_b = vars_and_mods_b.begin();
       iter_a != vars_and_mods_a.end() && iter_b != vars_and_mods_b.end();
       ++iter_a, ++iter_b) {
    // The templates have different variables, we fail!
    if (iter_a->variable_name != iter_b->variable_name)
      LogPrintf(LOG_FATAL, "Variable name mismatch: %s vs. %s\n",
                iter_a->variable_name.c_str(),
                iter_b->variable_name.c_str());
    // Variables without modifiers are ignored from the diff. They simply
    // get counted and the count is shown in verbose logging/
    if (iter_a->modifiers == "" || iter_b->modifiers == "") {
      no_modifiers_count++;
    } else {
      if (iter_a->modifiers != iter_b->modifiers &&
          !SuppressLameDiff(iter_a->modifiers, iter_b->modifiers)) {
        mismatch_count++;
        LogPrintf(LOG_INFO, "Difference for variable %s -- %s vs. %s\n",
                  iter_a->variable_name.c_str(),
                  iter_a->modifiers.c_str(), iter_b->modifiers.c_str());
      }
    }
  }

  LogPrintf(LOG_VERBOSE, "Variables Found: Total=%d; Diffs=%d; NoMods=%d\n",
            vars_and_mods_a.size(), mismatch_count, no_modifiers_count);

  return (mismatch_count == 0);
}